

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_safe.cpp
# Opt level: O3

Error * __thiscall
ot::commissioner::CommissionerSafe::Init
          (Error *__return_storage_ptr__,CommissionerSafe *this,Config *aConfig)

{
  string *this_00;
  ErrorCode EVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_01;
  undefined1 auVar2 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  CommissionerImpl *__tmp;
  format_args args;
  format_args args_00;
  shared_ptr<ot::commissioner::CommissionerImpl> impl;
  timeval kDefaultNonIoEventTimeout;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_d0;
  string local_c8;
  undefined1 local_a8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_a0;
  size_t local_98;
  undefined1 local_90 [16];
  parse_func local_80 [1];
  event_base *local_70;
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  timeval local_48;
  
  __return_storage_ptr__->mCode = kNone;
  this_00 = &__return_storage_ptr__->mMessage;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  _Stack_d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_48.tv_sec = 0x15180;
  local_48.tv_usec = 0;
  if ((this->mEventBase).mEventBase == (event_base *)0x0) {
    local_a8 = (undefined1  [8])((ulong)(uint)local_a8._4_4_ << 0x20);
    _Stack_a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x22d960;
    local_98 = 0x1b;
    local_90._0_8_ = (_func_int **)0x0;
    local_80[0] = (parse_func)0x0;
    pcVar6 = "failed to create event base";
    local_90._8_8_ = (format_string_checker<char> *)local_a8;
    do {
      pcVar5 = pcVar6 + 1;
      if (*pcVar6 == '}') {
        if ((pcVar5 == "") || (*pcVar5 != '}')) {
          fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar5 = pcVar6 + 2;
      }
      else if (*pcVar6 == '{') {
        pcVar5 = fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar6,"",(format_string_checker<char> *)local_a8);
      }
      pcVar6 = pcVar5;
    } while (pcVar5 != "");
    args_00.field_1.args_ = in_R9.args_;
    args_00.desc_ = (unsigned_long_long)local_a8;
    fmt::v10::vformat_abi_cxx11_
              (&local_c8,(v10 *)"failed to create event base",(string_view)ZEXT816(0x1b),args_00);
    local_70 = (event_base *)CONCAT44(local_70._4_4_,10);
    local_68[0] = local_58;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_68,local_c8._M_dataplus._M_p,
               local_c8._M_dataplus._M_p + local_c8._M_string_length);
    __return_storage_ptr__->mCode = (ErrorCode)local_70;
    std::__cxx11::string::operator=((string *)this_00,(string *)local_68);
    if (local_68[0] != local_58) {
      operator_delete(local_68[0]);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p);
    }
  }
  else {
    local_a8 = (undefined1  [8])((ulong)(uint)local_a8._4_4_ << 0x20);
    _Stack_a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x22d97c;
    local_98 = 0x1f;
    local_90._0_8_ = (_func_int **)0x0;
    local_80[0] = (parse_func)0x0;
    pcVar6 = "failed to initialize event base";
    local_90._8_8_ = (format_string_checker<char> *)local_a8;
    do {
      pcVar5 = pcVar6 + 1;
      if (*pcVar6 == '}') {
        if ((pcVar5 == "") || (*pcVar5 != '}')) {
          fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar5 = pcVar6 + 2;
      }
      else if (*pcVar6 == '{') {
        pcVar5 = fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar6,"",(format_string_checker<char> *)local_a8);
      }
      pcVar6 = pcVar5;
    } while (pcVar5 != "");
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_a8;
    fmt::v10::vformat_abi_cxx11_
              (&local_c8,(v10 *)"failed to initialize event base",(string_view)ZEXT816(0x1f),args);
    local_70 = (event_base *)CONCAT44(local_70._4_4_,0x13);
    local_68[0] = local_58;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_68,local_c8._M_dataplus._M_p,
               local_c8._M_dataplus._M_p + local_c8._M_string_length);
    __return_storage_ptr__->mCode = (ErrorCode)local_70;
    std::__cxx11::string::operator=((string *)this_00,(string *)local_68);
    if (local_68[0] != local_58) {
      operator_delete(local_68[0]);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p);
    }
    iVar4 = evthread_use_pthreads();
    if (iVar4 == 0) {
      iVar4 = evthread_make_base_notifiable((this->mEventBase).mEventBase);
      if (iVar4 == 0) {
        iVar4 = event_assign(&this->mInvokeEvent,(this->mEventBase).mEventBase,-1,0x10,Invoke,this);
        if (iVar4 == 0) {
          iVar4 = event_add(&this->mInvokeEvent,&local_48);
          if (iVar4 == 0) {
            local_70 = (this->mEventBase).mEventBase;
            local_a8 = (undefined1  [8])0x0;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
            __shared_count<ot::commissioner::CommissionerImpl,std::allocator<ot::commissioner::CommissionerImpl>,ot::commissioner::CommissionerHandler&,event_base*>
                      (&_Stack_a0,(CommissionerImpl **)local_a8,
                       (allocator<ot::commissioner::CommissionerImpl> *)&local_c8,this->mHandler,
                       &local_70);
            _Var3._M_pi = _Stack_a0._M_pi;
            auVar2 = local_a8;
            this_01._M_pi = _Stack_d0._M_pi;
            local_a8 = (undefined1  [8])0x0;
            _Stack_a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            _Stack_d0._M_pi = _Var3._M_pi;
            if (this_01._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01._M_pi);
              if (_Stack_a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_a0._M_pi);
              }
            }
            (*((Commissioner *)auVar2)->_vptr_Commissioner[2])(local_a8,auVar2,aConfig);
            __return_storage_ptr__->mCode = local_a8._0_4_;
            std::__cxx11::string::operator=((string *)this_00,(string *)&_Stack_a0);
            EVar1 = __return_storage_ptr__->mCode;
            if (_Stack_a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90) {
              operator_delete(_Stack_a0._M_pi);
            }
            if (EVar1 == kNone) {
              (this->mImpl).
              super___shared_ptr<ot::commissioner::CommissionerImpl,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr = (element_type *)auVar2;
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                        (&(this->mImpl).
                          super___shared_ptr<ot::commissioner::CommissionerImpl,_(__gnu_cxx::_Lock_policy)2>
                          ._M_refcount,&_Stack_d0);
              StartEventLoopThread(this);
            }
          }
        }
      }
    }
  }
  if (_Stack_d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_d0._M_pi);
  }
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerSafe::Init(const Config &aConfig)
{
    Error                             error;
    std::shared_ptr<CommissionerImpl> impl;

    // The default timeout value (1 day) for non-IO events (events with fd < 0).
    constexpr struct timeval kDefaultNonIoEventTimeout = {3600 * 24, 0};

    VerifyOrExit(mEventBase.Get() != nullptr, error = ERROR_OUT_OF_MEMORY("failed to create event base"));

    error = ERROR_UNKNOWN("failed to initialize event base");
    VerifyOrExit(evthread_use_pthreads() == 0);
    VerifyOrExit(evthread_make_base_notifiable(mEventBase.Get()) == 0);
    VerifyOrExit(event_assign(&mInvokeEvent, mEventBase.Get(), -1, EV_PERSIST, Invoke, this) == 0);

    // We add the event with a timeout value so that the event loop will not
    // exit prematurely because of no events.
    VerifyOrExit(event_add(&mInvokeEvent, &kDefaultNonIoEventTimeout) == 0);

    impl = std::make_shared<CommissionerImpl>(mHandler, mEventBase.Get());
    SuccessOrExit(error = impl->Init(aConfig));
    mImpl = impl;

    StartEventLoopThread();

exit:
    return error;
}